

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O1

_Bool write_stdout(void *buffer,size_t nbytes)

{
  uint __errnum;
  uint __fd;
  int iVar1;
  ssize_t sVar2;
  uint *puVar3;
  char *pcVar4;
  ulong unaff_R13;
  ssize_t nwrite;
  ulong uVar5;
  
  __fd = fileno(_stdout);
  uVar5 = 0;
  do {
    sVar2 = write(__fd,(void *)((long)buffer + uVar5),nbytes - uVar5);
    if (got_exit_signal == 0) {
      if (sVar2 < 0) {
        puVar3 = (uint *)__errno_location();
        __errnum = *puVar3;
        iVar1 = 3;
        if ((__errnum != 4) && (__errnum != 0xb)) {
          logmsg("writing to file descriptor: %d,",(ulong)__fd);
          pcVar4 = strerror(__errnum);
          logmsg("unrecoverable write() failure: (%d) %s",(ulong)__errnum,pcVar4);
          iVar1 = 1;
          unaff_R13 = 0xffffffffffffffff;
        }
      }
      else if (sVar2 == 0) {
        logmsg("put 0 writing to stdout");
        iVar1 = 1;
        unaff_R13 = 0;
      }
      else {
        uVar5 = uVar5 + sVar2;
        iVar1 = 0;
      }
    }
    else {
      logmsg("signalled to die");
      iVar1 = 1;
      unaff_R13 = 0xffffffffffffffff;
    }
    if ((iVar1 != 3) && (iVar1 != 0)) goto LAB_0010635d;
  } while (uVar5 < nbytes);
  unaff_R13 = uVar5;
  if (verbose == '\x01') {
    logmsg("wrote %zd bytes",uVar5);
  }
LAB_0010635d:
  if (unaff_R13 != nbytes) {
    logmsg("exiting...");
  }
  return unaff_R13 == nbytes;
}

Assistant:

static bool write_stdout(const void *buffer, size_t nbytes)
{
  ssize_t nwrite = fullwrite(fileno(stdout), buffer, nbytes);
  if(nwrite != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}